

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_diag_right_multiply(Integer s_a,Integer g_d)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  int *_ptr;
  void *buf;
  uint uVar12;
  long lVar13;
  int *_buf;
  Integer IVar14;
  uint uVar15;
  undefined1 (*pauVar16) [16];
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  Integer IVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  int64_t *jlptr;
  int64_t *ilptr;
  int *jptr;
  int *iptr;
  long local_b8;
  Integer local_b0;
  long local_a8;
  void *vptr;
  Integer khi;
  Integer klo;
  int local_84;
  Integer local_80;
  Integer local_78;
  Integer one;
  Integer jhi;
  Integer jlo;
  Integer local_58;
  Integer local_50;
  ulong local_48;
  Integer ihi;
  Integer ilo;
  
  lVar23 = s_a + 1000;
  lVar13 = g_d + 1000;
  IVar24 = SPA[lVar23].grp;
  local_80 = g_d;
  local_78 = s_a;
  local_50 = pnga_pgroup_nodeid(IVar24);
  local_b0 = pnga_pgroup_nnodes(IVar24);
  lVar22 = SPA[lVar23].type;
  local_48 = (ulong)(uint)SPA[lVar23].idx_size;
  iptr = (int *)0x0;
  jptr = (int *)0x0;
  ilptr = (int64_t *)0x0;
  jlptr = (int64_t *)0x0;
  one = 1;
  bVar25 = _ga_sync_begin != 0;
  local_84 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  local_b8 = lVar23 * 200;
  if (bVar25) {
    pnga_pgroup_sync(IVar24);
  }
  local_58 = IVar24;
  if (*(long *)((long)&SPA->idim + local_b8) != GA[lVar13].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) dimensions don\'t match",0);
  }
  if (lVar22 != GA[lVar13].type) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) data types don\'t match",0);
  }
  local_a8 = lVar22;
  if (GA[lVar13].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) vector not of dimension 1",0);
  }
  IVar24 = local_78;
  pnga_sprs_array_row_distribution(local_78,local_50,&ilo,&ihi);
  if (local_b0 < 1) {
    local_b0 = 0;
  }
  lVar22 = local_a8 + -0x3e9;
  lVar23 = 0;
  while (lVar23 != local_b0) {
    pnga_sprs_array_column_distribution(IVar24,lVar23,&jlo,&jhi);
    local_a8 = lVar23;
    if ((int)local_48 == 4) {
      pnga_sprs_array_access_col_block(IVar24,lVar23,&iptr,&jptr,&vptr);
      IVar24 = jlo;
      lVar23 = jhi + 1;
      buf = malloc((lVar23 - jlo) * *(long *)((long)&SPA->size + local_b8));
      klo = IVar24 + 1;
      khi = lVar23;
      pnga_get(local_80,&klo,&khi,buf,&one);
      if (vptr != (void *)0x0) {
        uVar12 = 0;
        switch(lVar22) {
        case 0:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar23 = IVar14 + 1;
            lVar13 = IVar14 - ilo;
            uVar12 = iptr[lVar23 - ilo] - iptr[lVar13];
            if (iptr[lVar23 - ilo] - iptr[lVar13] < 1) {
              uVar12 = 0;
            }
            for (uVar18 = 0; IVar14 = lVar23, uVar12 != uVar18; uVar18 = uVar18 + 1) {
              lVar17 = (long)iptr[lVar13] + uVar18;
              *(int *)((long)vptr + lVar17 * 4) =
                   *(int *)((long)buf + (jptr[lVar17] - IVar24) * 4) *
                   *(int *)((long)vptr + lVar17 * 4);
            }
          }
          break;
        case 1:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar23 = IVar14 + 1;
            lVar13 = (long)iptr[IVar14 - ilo];
            uVar15 = iptr[lVar23 - ilo] - iptr[IVar14 - ilo];
            if ((int)uVar15 < 1) {
              uVar15 = uVar12;
            }
            for (uVar18 = 0; IVar14 = lVar23, uVar15 != uVar18; uVar18 = uVar18 + 1) {
              *(long *)((long)vptr + uVar18 * 8 + lVar13 * 8) =
                   *(long *)((long)buf + (jptr[lVar13 + uVar18] - IVar24) * 8) *
                   *(long *)((long)vptr + uVar18 * 8 + lVar13 * 8);
            }
          }
          break;
        case 2:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar23 = IVar14 + 1;
            lVar13 = (long)iptr[IVar14 - ilo];
            uVar15 = iptr[lVar23 - ilo] - iptr[IVar14 - ilo];
            if ((int)uVar15 < 1) {
              uVar15 = uVar12;
            }
            for (uVar18 = 0; IVar14 = lVar23, uVar15 != uVar18; uVar18 = uVar18 + 1) {
              *(float *)((long)vptr + uVar18 * 4 + lVar13 * 4) =
                   *(float *)((long)vptr + uVar18 * 4 + lVar13 * 4) *
                   *(float *)((long)buf + (jptr[lVar13 + uVar18] - IVar24) * 4);
            }
          }
          break;
        case 3:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar23 = IVar14 + 1;
            lVar13 = (long)iptr[IVar14 - ilo];
            uVar15 = iptr[lVar23 - ilo] - iptr[IVar14 - ilo];
            if ((int)uVar15 < 1) {
              uVar15 = uVar12;
            }
            for (uVar18 = 0; IVar14 = lVar23, uVar15 != uVar18; uVar18 = uVar18 + 1) {
              *(double *)((long)vptr + uVar18 * 8 + lVar13 * 8) =
                   *(double *)((long)vptr + uVar18 * 8 + lVar13 * 8) *
                   *(double *)((long)buf + (jptr[lVar13 + uVar18] - IVar24) * 8);
            }
          }
          break;
        case 5:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar23 = IVar14 + 1;
            lVar13 = (long)iptr[IVar14 - ilo];
            uVar15 = iptr[lVar23 - ilo] - iptr[IVar14 - ilo];
            if ((int)uVar15 < 1) {
              uVar15 = uVar12;
            }
            for (uVar18 = 0; IVar14 = lVar23, uVar15 != uVar18; uVar18 = uVar18 + 1) {
              fVar2 = *(float *)((long)buf + (jptr[lVar13 + uVar18] - IVar24) * 8);
              fVar3 = *(float *)((long)buf + (jptr[lVar13 + uVar18] - IVar24) * 8 + 4);
              uVar6 = *(undefined8 *)((long)vptr + uVar18 * 8 + lVar13 * 8);
              fVar26 = (float)uVar6;
              fVar27 = (float)((ulong)uVar6 >> 0x20);
              *(ulong *)((long)vptr + uVar18 * 8 + lVar13 * 8) =
                   CONCAT44(fVar2 * fVar27 + fVar26 * fVar3,fVar2 * fVar26 + fVar27 * -fVar3);
            }
          }
          break;
        case 6:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar23 = IVar14 + 1;
            lVar13 = (long)iptr[IVar14 - ilo];
            uVar15 = iptr[lVar23 - ilo] - iptr[IVar14 - ilo];
            if ((int)uVar15 < 1) {
              uVar15 = uVar12;
            }
            for (lVar17 = 0; IVar14 = lVar23, (ulong)uVar15 * 4 != lVar17; lVar17 = lVar17 + 4) {
              lVar20 = (*(int *)((long)jptr + lVar17 + lVar13 * 4) - IVar24) * 0x10;
              dVar4 = *(double *)((long)buf + lVar20);
              dVar5 = *(double *)((long)buf + lVar20 + 8);
              pdVar1 = (double *)((long)vptr + lVar17 * 4 + lVar13 * 0x10);
              dVar10 = *pdVar1;
              dVar11 = pdVar1[1];
              dVar9 = dVar4 * dVar11 + dVar10 * dVar5;
              auVar7._8_4_ = SUB84(dVar9,0);
              auVar7._0_8_ = dVar4 * dVar10 + dVar11 * -dVar5;
              auVar7._12_4_ = (int)((ulong)dVar9 >> 0x20);
              *(undefined1 (*) [16])((long)vptr + lVar17 * 4 + lVar13 * 0x10) = auVar7;
            }
          }
          break;
        case 0xf:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar23 = IVar14 + 1;
            lVar13 = (long)iptr[IVar14 - ilo];
            uVar15 = iptr[lVar23 - ilo] - iptr[IVar14 - ilo];
            if ((int)uVar15 < 1) {
              uVar15 = uVar12;
            }
            for (uVar18 = 0; IVar14 = lVar23, uVar15 != uVar18; uVar18 = uVar18 + 1) {
              *(long *)((long)vptr + uVar18 * 8 + lVar13 * 8) =
                   *(long *)((long)buf + (jptr[lVar13 + uVar18] - IVar24) * 8) *
                   *(long *)((long)vptr + uVar18 * 8 + lVar13 * 8);
            }
          }
        }
      }
    }
    else {
      pnga_sprs_array_access_col_block(IVar24,lVar23,&ilptr,&jlptr,&vptr);
      IVar24 = jlo;
      lVar23 = jhi + 1;
      buf = malloc((lVar23 - jlo) * *(long *)((long)&SPA->size + local_b8));
      klo = IVar24 + 1;
      khi = lVar23;
      pnga_get(local_80,&klo,&khi,buf,&one);
      if (vptr != (void *)0x0) {
        lVar23 = 0;
        switch(lVar22) {
        case 0:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar13 = IVar14 + 1;
            lVar17 = ilptr[IVar14 - ilo];
            lVar20 = ilptr[lVar13 - ilo] - lVar17;
            if (ilptr[lVar13 - ilo] - lVar17 < 1) {
              lVar20 = lVar23;
            }
            for (lVar19 = 0; IVar14 = lVar13, lVar20 != lVar19; lVar19 = lVar19 + 1) {
              *(int *)((long)vptr + lVar19 * 4 + lVar17 * 4) =
                   *(int *)((long)buf + (jlptr[lVar17 + lVar19] - IVar24) * 4) *
                   *(int *)((long)vptr + lVar19 * 4 + lVar17 * 4);
            }
          }
          break;
        case 1:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar13 = IVar14 + 1;
            lVar20 = IVar14 - ilo;
            lVar17 = ilptr[lVar13 - ilo] - ilptr[lVar20];
            if (ilptr[lVar13 - ilo] - ilptr[lVar20] < 1) {
              lVar17 = lVar23;
            }
            for (lVar19 = 0; IVar14 = lVar13, lVar17 != lVar19; lVar19 = lVar19 + 1) {
              lVar21 = ilptr[lVar20] + lVar19;
              *(long *)((long)vptr + lVar21 * 8) =
                   *(long *)((long)buf + (jlptr[lVar21] - IVar24) * 8) *
                   *(long *)((long)vptr + lVar21 * 8);
            }
          }
          break;
        case 2:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar13 = IVar14 + 1;
            lVar17 = ilptr[IVar14 - ilo];
            lVar20 = ilptr[lVar13 - ilo] - lVar17;
            if (ilptr[lVar13 - ilo] - lVar17 < 1) {
              lVar20 = lVar23;
            }
            for (lVar19 = 0; IVar14 = lVar13, lVar20 != lVar19; lVar19 = lVar19 + 1) {
              *(float *)((long)vptr + lVar19 * 4 + lVar17 * 4) =
                   *(float *)((long)vptr + lVar19 * 4 + lVar17 * 4) *
                   *(float *)((long)buf + (jlptr[lVar17 + lVar19] - IVar24) * 4);
            }
          }
          break;
        case 3:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar13 = IVar14 + 1;
            lVar17 = ilptr[IVar14 - ilo];
            lVar20 = ilptr[lVar13 - ilo] - lVar17;
            if (ilptr[lVar13 - ilo] - lVar17 < 1) {
              lVar20 = lVar23;
            }
            for (lVar19 = 0; IVar14 = lVar13, lVar20 != lVar19; lVar19 = lVar19 + 1) {
              *(double *)((long)vptr + lVar19 * 8 + lVar17 * 8) =
                   *(double *)((long)vptr + lVar19 * 8 + lVar17 * 8) *
                   *(double *)((long)buf + (jlptr[lVar17 + lVar19] - IVar24) * 8);
            }
          }
          break;
        case 5:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar13 = IVar14 + 1;
            lVar17 = ilptr[IVar14 - ilo];
            lVar20 = ilptr[lVar13 - ilo] - lVar17;
            if (ilptr[lVar13 - ilo] - lVar17 < 1) {
              lVar20 = lVar23;
            }
            for (lVar19 = 0; IVar14 = lVar13, lVar20 != lVar19; lVar19 = lVar19 + 1) {
              fVar2 = *(float *)((long)buf + (jlptr[lVar17 + lVar19] - IVar24) * 8);
              fVar3 = *(float *)((long)buf + (jlptr[lVar17 + lVar19] - IVar24) * 8 + 4);
              uVar6 = *(undefined8 *)((long)vptr + lVar19 * 8 + lVar17 * 8);
              fVar26 = (float)uVar6;
              fVar27 = (float)((ulong)uVar6 >> 0x20);
              *(ulong *)((long)vptr + lVar19 * 8 + lVar17 * 8) =
                   CONCAT44(fVar2 * fVar27 + fVar26 * fVar3,fVar2 * fVar26 + fVar27 * -fVar3);
            }
          }
          break;
        case 6:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar13 = IVar14 + 1;
            lVar17 = ilptr[IVar14 - ilo];
            lVar20 = ilptr[lVar13 - ilo] - lVar17;
            if (ilptr[lVar13 - ilo] - lVar17 < 1) {
              lVar20 = lVar23;
            }
            pauVar16 = (undefined1 (*) [16])(lVar17 * 0x10 + (long)vptr);
            for (lVar19 = 0; IVar14 = lVar13, lVar20 != lVar19; lVar19 = lVar19 + 1) {
              lVar21 = (jlptr[lVar17 + lVar19] - IVar24) * 0x10;
              dVar4 = *(double *)((long)buf + lVar21);
              dVar5 = *(double *)((long)buf + lVar21 + 8);
              dVar9 = dVar4 * *(double *)(*pauVar16 + 8) + *(double *)*pauVar16 * dVar5;
              auVar8._8_4_ = SUB84(dVar9,0);
              auVar8._0_8_ = dVar4 * *(double *)*pauVar16 + *(double *)(*pauVar16 + 8) * -dVar5;
              auVar8._12_4_ = (int)((ulong)dVar9 >> 0x20);
              *pauVar16 = auVar8;
              pauVar16 = pauVar16 + 1;
            }
          }
          break;
        case 0xf:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar13 = IVar14 + 1;
            lVar17 = ilptr[IVar14 - ilo];
            lVar20 = ilptr[lVar13 - ilo] - lVar17;
            if (ilptr[lVar13 - ilo] - lVar17 < 1) {
              lVar20 = lVar23;
            }
            for (lVar19 = 0; IVar14 = lVar13, lVar20 != lVar19; lVar19 = lVar19 + 1) {
              *(long *)((long)vptr + lVar19 * 8 + lVar17 * 8) =
                   *(long *)((long)buf + (jlptr[lVar17 + lVar19] - IVar24) * 8) *
                   *(long *)((long)vptr + lVar19 * 8 + lVar17 * 8);
            }
          }
        }
      }
    }
    free(buf);
    IVar24 = local_78;
    lVar23 = local_a8 + 1;
  }
  if (local_84 != 0) {
    pnga_pgroup_sync(local_58);
  }
  return;
}

Assistant:

void pnga_sprs_array_diag_right_multiply(Integer s_a, Integer g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer d_hdl = GA_OFFSET + g_d;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi, jlo, jhi, klo, khi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr = NULL, *jptr = NULL;
  int64_t *ilptr = NULL, *jlptr = NULL;
  Integer one = 1;
  void *vbuf;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* check for basic compatibility */
  if (SPA[hdl].idim != GA[d_hdl].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) dimensions don't match",0);
  }
  if (type != GA[d_hdl].type) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) data types don't match",0);
  }
  if (GA[d_hdl].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) vector not of dimension 1",0);
  }

#define SPRS_REAL_RIGHT_MULTIPLY_M(_type,_iptr,_jptr)                  \
  {                                                                    \
    _type *_buf = (_type*)vbuf;                                        \
    _type *_ptr = (_type*)vptr;                                        \
    for (i=ilo; i<=ihi; i++) {                                         \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                             \
      for (j=0; j<ncols; j++) {                                        \
        _ptr[_iptr[i-ilo]+j] = _ptr[_iptr[i-ilo]+j]                    \
        * _buf[_jptr[_iptr[i-ilo]+j]-jlo];                             \
      }                                                                \
    }                                                                  \
  }

#define SPRS_COMPLEX_RIGHT_MULTIPLY_M(_type,_iptr,_jptr)               \
  {                                                                    \
    _type *_buf = (_type*)vbuf;                                        \
    _type *_ptr = (_type*)vptr;                                        \
    _type rval, ival, rbuf, ibuf;                                      \
    for (i=ilo; i<=ihi; i++) {                                         \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                             \
      for (j=0; j<ncols; j++) {                                        \
        rbuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)];                    \
        ibuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)+1];                  \
        rval = _ptr[2*(_iptr[i-ilo]+j)];                               \
        ival = _ptr[2*(_iptr[i-ilo]+j)+1];                             \
        _ptr[2*(_iptr[i-ilo]+j)] = rbuf*rval-ibuf*ival;                \
        _ptr[2*(_iptr[i-ilo]+j)+1] = rbuf*ival+ibuf*rval;              \
      }                                                                \
    }                                                                  \
  }
  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      vbuf = malloc((jhi-jlo+1)*SPA[hdl].size);
      klo = jlo+1;
      khi = jhi+1;
      pnga_get(g_d,&klo,&khi,vbuf,&one);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(int,iptr,jptr);
        } else if (type == C_LONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long,iptr,jptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long long,iptr,jptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(float,iptr,jptr);
        } else if (type == C_DBL) {
          SPRS_REAL_RIGHT_MULTIPLY_M(double,iptr,jptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(float,iptr,jptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      vbuf = malloc((jhi-jlo+1)*SPA[hdl].size);
      klo = jlo+1;
      khi = jhi+1;
      pnga_get(g_d,&klo,&khi,vbuf,&one);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(int,ilptr,jlptr);
        } else if (type == C_LONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long,ilptr,jlptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long long,ilptr,jlptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(float,ilptr,jlptr);
        } else if (type == C_DBL) {
          SPRS_REAL_RIGHT_MULTIPLY_M(double,ilptr,jlptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(float,ilptr,jlptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(double,ilptr,jlptr);
        }
      }
    }
    free(vbuf);
  }

#undef SPRS_REAL_RIGHT_MULTIPLY_M
#undef SPRS_COMPLEX_RIGHT_MULTIPLY_M

  if (local_sync_end) pnga_pgroup_sync(grp);
}